

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::CIRS2ICRS(CESkyCoord *in_cirs,CESkyCoord *out_icrs,CEDate *date)

{
  double dVar1;
  double return_dec;
  double return_ra;
  double tdb2;
  double tdb1;
  double eo;
  double local_f8;
  double local_f0;
  CEAngle local_e8;
  double local_d8;
  CEAngle local_d0;
  double local_c0;
  double local_b8;
  CEDate local_b0;
  CEDate local_70;
  undefined1 local_30 [8];
  
  local_b8 = 0.0;
  local_c0 = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TDB((double *)&local_70,&local_b8,&local_c0);
  local_f0 = 0.0;
  local_f8 = 0.0;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*in_cirs->_vptr_CESkyCoord[3])(&local_e8,in_cirs,&local_70);
  local_d8 = CEAngle::operator_cast_to_double(&local_e8);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_b0,dVar1,JD);
  (*in_cirs->_vptr_CESkyCoord[4])(&local_d0,in_cirs,&local_b0);
  dVar1 = CEAngle::operator_cast_to_double(&local_d0);
  iauAtic13(local_d8,SUB84(dVar1,0),local_b8,local_c0,&local_f0,&local_f8,local_30);
  CEAngle::~CEAngle(&local_d0);
  CEDate::~CEDate(&local_b0);
  CEAngle::~CEAngle(&local_e8);
  CEDate::~CEDate(&local_70);
  CEAngle::CEAngle((CEAngle *)&local_70,&local_f0);
  CEAngle::CEAngle((CEAngle *)&local_b0,&local_f8);
  local_e8._vptr_CEAngle._0_4_ = 1;
  (*out_icrs->_vptr_CESkyCoord[5])(out_icrs,&local_70,&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_70);
  return;
}

Assistant:

void CESkyCoord::CIRS2ICRS(const CESkyCoord& in_cirs, 
                           CESkyCoord*       out_icrs,
                           const CEDate&     date)
{
    double eo; // Equation of the origins

    // Compute the TDB date
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);

    // Use the SOFA library to compute the new date
    double return_ra(0.0);
    double return_dec(0.0);
    iauAtic13(in_cirs.XCoord(), in_cirs.YCoord(), 
              tdb1, tdb2, 
              &return_ra, &return_dec, &eo);

    // Subtract the eo from RA if J2000 coordinates are desired
    //*return_ra -= eo;

    out_icrs->SetCoordinates(CEAngle(return_ra), CEAngle(return_dec),
                             CESkyCoordType::ICRS);
    return;
}